

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

void SetPreviousTracker(Lexer *lexer)

{
  LexerTracker *pLVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar2 = (lexer->tracker).col;
  iVar4 = lexer->previousTrackerSpot + 1;
  iVar5 = 0;
  if (iVar4 < lexer->totalTrackers) {
    iVar5 = iVar4;
  }
  lexer->previousTrackerSpot = iVar5;
  lexer->previousTrackers[iVar5].col = iVar2;
  iVar2 = (lexer->tracker).tokenEnd;
  iVar4 = (lexer->tracker).currentTokenPosition;
  iVar3 = (lexer->tracker).row;
  pLVar1 = lexer->previousTrackers + iVar5;
  pLVar1->tokenStart = (lexer->tracker).tokenStart;
  pLVar1->tokenEnd = iVar2;
  pLVar1->currentTokenPosition = iVar4;
  pLVar1->row = iVar3;
  return;
}

Assistant:

void SetPreviousTracker(Lexer* lexer){

	lexer->previousTrackerSpot++;
	if (lexer->previousTrackerSpot >= lexer->totalTrackers){
		lexer->previousTrackerSpot = 0;
	}

	LexerTracker* previous = &lexer->previousTrackers[lexer->previousTrackerSpot];

	previous->col = lexer->tracker.col;
	previous->currentTokenPosition = lexer->tracker.currentTokenPosition;
	previous->row = lexer->tracker.row;
	previous->tokenEnd = lexer->tracker.tokenEnd;
	previous->tokenStart = lexer->tracker.tokenStart;
}